

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void container_printf_as_uint32_array(container_t *c,uint8_t typecode,uint32_t base)

{
  uint8_t local_11;
  uint32_t base_local;
  uint8_t typecode_local;
  container_t *c_local;
  
  local_11 = typecode;
  _base_local = (array_container_t *)c;
  _base_local = (array_container_t *)container_unwrap_shared(c,&local_11);
  if (local_11 == '\x01') {
    bitset_container_printf_as_uint32_array((bitset_container_t *)_base_local,base);
  }
  else if (local_11 == '\x02') {
    array_container_printf_as_uint32_array(_base_local,base);
  }
  else {
    run_container_printf_as_uint32_array((run_container_t *)_base_local,base);
  }
  return;
}

Assistant:

void container_printf_as_uint32_array(
    const container_t *c, uint8_t typecode,
    uint32_t base
){
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_printf_as_uint32_array(
                const_CAST_bitset(c), base);
            return;
        case ARRAY_CONTAINER_TYPE:
            array_container_printf_as_uint32_array(
                const_CAST_array(c), base);
            return;
        case RUN_CONTAINER_TYPE:
            run_container_printf_as_uint32_array(
                const_CAST_run(c), base);
            return;
        default:
            __builtin_unreachable();
    }
}